

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,wchar_t *wideString)

{
  size_t sVar1;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  output;
  wchar_t *in_RSI;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  size_t length;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff98;
  wchar_t *begin;
  size_type in_stack_ffffffffffffffb8;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(in_RDI);
  if ((in_RSI != (wchar_t *)0x0) && (sVar1 = wcslen(in_RSI), sVar1 != 0)) {
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    reserve(in_RDI,in_stack_ffffffffffffffb8);
    begin = in_RSI + sVar1;
    output = std::
             back_inserter<std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>
                       (in_stack_ffffffffffffff98);
    Utf<32u>::
    fromWide<wchar_t_const*,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>>
              (begin,in_RSI,output);
  }
  return;
}

Assistant:

String::String(const wchar_t* wideString)
{
    if (wideString)
    {
        std::size_t length = std::wcslen(wideString);
        if (length > 0)
        {
            m_string.reserve(length + 1);
            Utf32::fromWide(wideString, wideString + length, std::back_inserter(m_string));
        }
    }
}